

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
ObjectTest_basic_get_vector_Test::~ObjectTest_basic_get_vector_Test
          (ObjectTest_basic_get_vector_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_vector) {
	object obj;

	EXPECT_TRUE(obj.get<std::vector<bool>>().empty());
	EXPECT_TRUE(obj.get<std::vector<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::vector<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::vector<short>>().empty());
	EXPECT_TRUE(obj.get<std::vector<int>>().empty());
	EXPECT_TRUE(obj.get<std::vector<long>>().empty());
	EXPECT_TRUE(obj.get<std::vector<long long>>().empty());
	EXPECT_TRUE(obj.get<std::vector<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::vector<float>>().empty());
	EXPECT_TRUE(obj.get<std::vector<double>>().empty());
	EXPECT_TRUE(obj.get<std::vector<long double>>().empty());
	EXPECT_TRUE(obj.get<std::vector<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::vector<object>>().empty());
}